

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseEncName(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  bool bVar4;
  xmlChar *tmp;
  int local_28;
  int iStack_24;
  xmlChar cur;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (byte *)0x0;
  local_28 = 10;
  bVar1 = *ctxt->input->cur;
  if (((bVar1 < 0x61) || (0x7a < bVar1)) && ((bVar1 < 0x41 || (0x5a < bVar1)))) {
    xmlFatalErr(ctxt,XML_ERR_ENCODING_NAME,(char *)0x0);
  }
  else {
    _size = (byte *)(*xmlMallocAtomic)(10);
    if (_size == (byte *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlChar *)0x0;
    }
    *_size = bVar1;
    xmlNextChar(ctxt);
    tmp._7_1_ = *ctxt->input->cur;
    iStack_24 = 1;
    while( true ) {
      if (((tmp._7_1_ < 0x61) || (bVar4 = true, 0x7a < tmp._7_1_)) &&
         (((tmp._7_1_ < 0x41 || (bVar4 = true, 0x5a < tmp._7_1_)) &&
          ((((tmp._7_1_ < 0x30 || (bVar4 = true, 0x39 < tmp._7_1_)) &&
            (bVar4 = true, tmp._7_1_ != 0x2e)) && (bVar4 = true, tmp._7_1_ != 0x5f)))))) {
        bVar4 = tmp._7_1_ == 0x2d;
      }
      if (!bVar4) break;
      pbVar2 = _size;
      if (local_28 <= iStack_24 + 1) {
        local_28 = local_28 << 1;
        pbVar2 = (byte *)(*xmlRealloc)(_size,(long)local_28);
        if (pbVar2 == (byte *)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
      }
      _size = pbVar2;
      iVar3 = iStack_24 + 1;
      _size[iStack_24] = tmp._7_1_;
      xmlNextChar(ctxt);
      tmp._7_1_ = *ctxt->input->cur;
      iStack_24 = iVar3;
      if (tmp._7_1_ == 0) {
        if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base))
           && ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
          xmlSHRINK(ctxt);
        }
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        tmp._7_1_ = *ctxt->input->cur;
      }
    }
    _size[iStack_24] = 0;
  }
  return _size;
}

Assistant:

xmlChar *
xmlParseEncName(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    xmlChar cur;

    cur = CUR;
    if (((cur >= 'a') && (cur <= 'z')) ||
        ((cur >= 'A') && (cur <= 'Z'))) {
	buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	if (buf == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}

	buf[len++] = cur;
	NEXT;
	cur = CUR;
	while (((cur >= 'a') && (cur <= 'z')) ||
	       ((cur >= 'A') && (cur <= 'Z')) ||
	       ((cur >= '0') && (cur <= '9')) ||
	       (cur == '.') || (cur == '_') ||
	       (cur == '-')) {
	    if (len + 1 >= size) {
	        xmlChar *tmp;

		size *= 2;
		tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
		if (tmp == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    xmlFree(buf);
		    return(NULL);
		}
		buf = tmp;
	    }
	    buf[len++] = cur;
	    NEXT;
	    cur = CUR;
	    if (cur == 0) {
	        SHRINK;
		GROW;
		cur = CUR;
	    }
        }
	buf[len] = 0;
    } else {
	xmlFatalErr(ctxt, XML_ERR_ENCODING_NAME, NULL);
    }
    return(buf);
}